

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirINCBIN(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  fullpath_ref_t file;
  aint offset;
  aint length;
  aint val;
  aint local_24;
  
  local_24 = (aint)((ulong)in_RAX >> 0x20);
  file = GetInputFile(&lp);
  bVar1 = anyComma(&lp);
  if (!bVar1) {
    offset = 0;
    length = 0x7fffffff;
    goto LAB_0010e240;
  }
  bVar1 = anyComma(&lp);
  if (bVar1) {
    lp = lp + -1;
    offset = 0;
LAB_0010e1c3:
    bVar2 = anyComma(&lp);
    bVar1 = true;
    length = 0x7fffffff;
    if ((bVar2) &&
       (iVar3 = ParseExpressionNoSyntaxError(&lp,&local_24), length = local_24, iVar3 == 0)) {
      Error("[INCBIN] Syntax error in <length>",bp,SUPPRESS);
      goto LAB_0010e238;
    }
  }
  else {
    iVar3 = ParseExpressionNoSyntaxError(&lp,&local_24);
    offset = local_24;
    if (iVar3 != 0) goto LAB_0010e1c3;
    Error("[INCBIN] Syntax error in <offset>",bp,SUPPRESS);
    offset = 0;
LAB_0010e238:
    bVar1 = false;
    length = 0x7fffffff;
  }
  if (!bVar1) {
    return;
  }
LAB_0010e240:
  BinIncFile(file,offset,length);
  return;
}

Assistant:

static void dirINCBIN() {
	int offset = 0, length = INT_MAX;
	fullpath_ref_t fnaam = GetInputFile(lp);
	if (anyComma(lp)) {
		aint val;
		if (!anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCBIN] Syntax error in <offset>", bp, SUPPRESS);
				return;
			}
			offset = val;
		} else --lp;		// there was second comma right after, reread it
		if (anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCBIN] Syntax error in <length>", bp, SUPPRESS);
				return;
			}
			length = val;
		}
	}
	BinIncFile(fnaam, offset, length);
}